

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitAtomicWait(I64ToI32Lowering *this,AtomicWait *curr)

{
  Builder *this_00;
  Builder *pBVar1;
  char *pcVar2;
  Call *expression;
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Const *local_a0;
  Expression *local_98;
  Expression *pEStack_90;
  Expression *local_88;
  undefined1 *local_80;
  TempVar local_78;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_58;
  size_t local_40;
  allocator_type local_31;
  
  pcVar2 = DAT_010b1198;
  this_00 = (this->builder)._M_t.
            super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
            super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
            super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  local_40 = ABI::wasm2js::ATOMIC_WAIT_I32;
  local_a0 = Builder::makeConst<int>(this_00,(int)(curr->offset).addr);
  local_98 = curr->ptr;
  pEStack_90 = curr->expected;
  local_88 = curr->timeout;
  pBVar1 = (this->builder)._M_t.
           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
           super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
  fetchOutParam(&local_78,this,local_88);
  if (local_78.moved != true) {
    local_80 = (undefined1 *)MixedArena::allocSpace(&pBVar1->wasm->allocator,0x18,8);
    *local_80 = 8;
    *(Index *)(local_80 + 0x10) = local_78.idx;
    *(undefined8 *)(local_80 + 8) = 2;
    __l._M_len = 5;
    __l._M_array = (iterator)&local_a0;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              (&local_58,__l,&local_31);
    target.super_IString.str._M_str = pcVar2;
    target.super_IString.str._M_len = local_40;
    expression = Builder::makeCall(this_00,target,&local_58,(Type)0x2,false);
    Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                ).
                super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
               (Expression *)expression);
    if (local_58.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl
        .super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.
                            super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    TempVar::~TempVar(&local_78);
    return;
  }
  __assert_fail("!moved",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    // The last parameter is an i64, so we cannot leave it as it is
    replaceCurrent(builder->makeCall(
      ABI::wasm2js::ATOMIC_WAIT_I32,
      {builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->expected,
       curr->timeout,
       builder->makeLocalGet(fetchOutParam(curr->timeout), Type::i32)},
      Type::i32));
  }